

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::PropagateOnAll_CopyConstructorWithDifferentAlloc_Test::
PropagateOnAll_CopyConstructorWithDifferentAlloc_Test
          (PropagateOnAll_CopyConstructorWithDifferentAlloc_Test *this)

{
  PropagateOnAll_CopyConstructorWithDifferentAlloc_Test *this_local;
  
  PropagateTest<7>::PropagateTest(&this->super_PropagateOnAll);
  (this->super_PropagateOnAll).super_Test._vptr_Test =
       (_func_int **)&PTR__PropagateOnAll_CopyConstructorWithDifferentAlloc_Test_001e3c80;
  return;
}

Assistant:

TEST_F(PropagateOnAll, CopyConstructorWithDifferentAlloc) {
  auto it = t1.insert(0).first;
  Table u(t1, a2);
  EXPECT_EQ(a2, u.get_allocator());
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(1, a2.num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(1, it->num_copies());
}